

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmain.cpp
# Opt level: O0

void CTcMain::S_log_error
               (CTcTokFileDesc *linedesc,long linenum,int *err_counter,int *warn_counter,
               unsigned_long options,int *suppress_list,size_t suppress_cnt,tc_severity_t severity,
               CVmException *exc)

{
  int iVar1;
  char *pcVar2;
  undefined8 in_R8;
  unsigned_long in_R9;
  CVmException *in_stack_00000018;
  char msgbuf [1024];
  char *msg;
  int *in_stack_00001ba0;
  int *in_stack_00001ba8;
  int *in_stack_00001bb0;
  int *in_stack_00001bb8;
  long in_stack_00001bc0;
  CTcTokFileDesc *in_stack_00001bc8;
  unsigned_long in_stack_00001be0;
  int *in_stack_00001be8;
  size_t in_stack_00001bf0;
  tc_severity_t in_stack_00001bf8;
  int in_stack_00001c00;
  tc_severity_t severity_00;
  undefined4 in_stack_fffffffffffffb7c;
  char *in_stack_fffffffffffffb80;
  CVmException *in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc08;
  size_t in_stack_fffffffffffffc10;
  char *in_stack_fffffffffffffc18;
  
  severity_00 = (tc_severity_t)((ulong)in_R8 >> 0x20);
  iVar1 = CVmException::get_error_code(in_stack_00000018);
  pcVar2 = log_msg_internal_1(in_stack_00001bc8,in_stack_00001bc0,in_stack_00001bb8,
                              in_stack_00001bb0,in_stack_00001ba8,in_stack_00001ba0,
                              in_stack_00001be0,in_stack_00001be8,in_stack_00001bf0,
                              in_stack_00001bf8,in_stack_00001c00);
  if (pcVar2 != (char *)0x0) {
    err_format_msg(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                   in_stack_fffffffffffffc00);
    format_message(in_stack_fffffffffffffb80,CONCAT44(in_stack_fffffffffffffb7c,iVar1));
    log_msg_internal_2(in_R9,severity_00);
  }
  return;
}

Assistant:

void CTcMain::S_log_error(CTcTokFileDesc *linedesc, long linenum,
                          int *err_counter, int *warn_counter,
                          unsigned long options,
                          const int *suppress_list, size_t suppress_cnt,
                          tc_severity_t severity, CVmException *exc)
{
    const char *msg;
    char msgbuf[1024];
    
    /* show the prefix */
    msg = log_msg_internal_1(linedesc, linenum, err_counter, warn_counter,
                             0, 0, options, suppress_list, suppress_cnt,
                             severity, exc->get_error_code());

    /* if the message is suppressed, we're done */
    if (msg == 0)
        return;

    /* format the message using arguments stored in the exception */
    err_format_msg(msgbuf, sizeof(msgbuf), msg, exc);

    /* print the error */
    format_message(msgbuf, options);

    /* show the suffix */
    log_msg_internal_2(options, severity);
}